

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::OrientedDiscMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  __int_type_conflict _Var13;
  RTCFilterFunctionN p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined8 *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  float in_register_0000159c;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 *local_2b8;
  RTCFilterFunctionNArguments local_2b0;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  RTCHitN local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  undefined1 local_190 [16];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined1 auVar51 [64];
  
  pSVar10 = context->scene;
  uVar25 = Disc->sharedGeomID;
  uVar27 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[uVar25].ptr;
  lVar12 = *(long *)&pGVar11->field_0x58;
  _Var13 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar31 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar30 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar35._16_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar30);
  auVar35._0_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar27);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar32);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar31);
  uVar34 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar33 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar29 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar29);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar34);
  uVar26 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar39._16_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar26);
  auVar39._0_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar33);
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var14 = pGVar11[1].intersectionFilterN;
  auVar48._16_16_ = *(undefined1 (*) [16])(lVar12 + uVar30 * (long)p_Var14);
  auVar48._0_16_ = *(undefined1 (*) [16])(lVar12 + uVar27 * (long)p_Var14);
  auVar52._16_16_ = *(undefined1 (*) [16])(lVar12 + uVar32 * (long)p_Var14);
  auVar52._0_16_ = *(undefined1 (*) [16])(lVar12 + uVar31 * (long)p_Var14);
  auVar54._16_16_ = *(undefined1 (*) [16])(lVar12 + uVar29 * (long)p_Var14);
  auVar54._0_16_ = *(undefined1 (*) [16])(lVar12 + uVar34 * (long)p_Var14);
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar12 + (long)p_Var14 * uVar26);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar12 + uVar33 * (long)p_Var14);
  auVar41 = vunpcklps_avx(auVar35,auVar38);
  auVar22 = vunpckhps_avx(auVar35,auVar38);
  auVar35 = vunpcklps_avx(auVar37,auVar39);
  auVar44 = vunpckhps_avx(auVar37,auVar39);
  auVar36 = vunpcklps_avx(auVar41,auVar35);
  auVar50 = vunpckhps_avx(auVar41,auVar35);
  local_240 = vunpcklps_avx(auVar22,auVar44);
  auVar37 = vunpcklps_avx(auVar48,auVar54);
  auVar41 = vunpckhps_avx(auVar48,auVar54);
  auVar38 = vunpcklps_avx(auVar52,auVar58);
  auVar35 = vunpckhps_avx(auVar52,auVar58);
  local_220 = vunpcklps_avx(auVar41,auVar35);
  local_c0 = vunpcklps_avx(auVar37,auVar38);
  local_a0 = vunpckhps_avx(auVar37,auVar38);
  local_130 = vshufps_avx(ZEXT416(uVar25),ZEXT416(uVar25),0);
  local_140 = local_130;
  fVar1 = *(float *)(ray + k * 4 + 0x10);
  auVar49._4_4_ = fVar1;
  auVar49._0_4_ = fVar1;
  auVar49._8_4_ = fVar1;
  auVar49._12_4_ = fVar1;
  auVar49._16_4_ = fVar1;
  auVar49._20_4_ = fVar1;
  auVar49._24_4_ = fVar1;
  auVar49._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar56._4_4_ = fVar4;
  auVar56._0_4_ = fVar4;
  auVar56._8_4_ = fVar4;
  auVar56._12_4_ = fVar4;
  auVar60._0_4_ = fVar2 * local_c0._0_4_ + fVar3 * local_a0._0_4_ + fVar4 * local_220._0_4_;
  auVar60._4_4_ = fVar2 * local_c0._4_4_ + fVar3 * local_a0._4_4_ + fVar4 * local_220._4_4_;
  auVar60._8_4_ = fVar2 * local_c0._8_4_ + fVar3 * local_a0._8_4_ + fVar4 * local_220._8_4_;
  auVar60._12_4_ = fVar2 * local_c0._12_4_ + fVar3 * local_a0._12_4_ + fVar4 * local_220._12_4_;
  auVar60._16_4_ = fVar2 * local_c0._16_4_ + fVar3 * local_a0._16_4_ + fVar4 * local_220._16_4_;
  auVar60._20_4_ = fVar2 * local_c0._20_4_ + fVar3 * local_a0._20_4_ + fVar4 * local_220._20_4_;
  auVar60._24_4_ = fVar2 * local_c0._24_4_ + fVar3 * local_a0._24_4_ + fVar4 * local_220._24_4_;
  auVar60._28_4_ = in_register_0000159c + in_register_0000159c + 0.0;
  auVar35 = vcmpps_avx(auVar60,ZEXT432(0) << 0x20,0);
  auVar57 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar63._16_16_ = auVar57;
  auVar63._0_16_ = auVar57;
  auVar41 = vcvtdq2ps_avx(auVar63);
  auVar37 = vcmpps_avx(_DAT_02020f40,auVar41,1);
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = &DAT_3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar65._16_4_ = 0x3f800000;
  auVar65._20_4_ = 0x3f800000;
  auVar65._24_4_ = 0x3f800000;
  auVar65._28_4_ = 0x3f800000;
  auVar41 = vblendvps_avx(auVar60,auVar65,auVar35);
  fVar5 = *(float *)(ray + k * 4 + 0x20);
  auVar61._4_4_ = fVar5;
  auVar61._0_4_ = fVar5;
  auVar61._8_4_ = fVar5;
  auVar61._12_4_ = fVar5;
  auVar61._16_4_ = fVar5;
  auVar61._20_4_ = fVar5;
  auVar61._24_4_ = fVar5;
  auVar61._28_4_ = fVar5;
  auVar35 = vandnps_avx(auVar35,auVar37);
  auVar37 = vsubps_avx(local_240,auVar61);
  auVar38 = vsubps_avx(auVar50,auVar49);
  fVar6 = *(float *)(ray + k * 4);
  auVar64._4_4_ = fVar6;
  auVar64._0_4_ = fVar6;
  auVar64._8_4_ = fVar6;
  auVar64._12_4_ = fVar6;
  auVar64._16_4_ = fVar6;
  auVar64._20_4_ = fVar6;
  auVar64._24_4_ = fVar6;
  auVar64._28_4_ = fVar6;
  auVar39 = vsubps_avx(auVar36,auVar64);
  auVar40._0_4_ =
       local_c0._0_4_ * auVar39._0_4_ +
       auVar37._0_4_ * local_220._0_4_ + local_a0._0_4_ * auVar38._0_4_;
  auVar40._4_4_ =
       local_c0._4_4_ * auVar39._4_4_ +
       auVar37._4_4_ * local_220._4_4_ + local_a0._4_4_ * auVar38._4_4_;
  auVar40._8_4_ =
       local_c0._8_4_ * auVar39._8_4_ +
       auVar37._8_4_ * local_220._8_4_ + local_a0._8_4_ * auVar38._8_4_;
  auVar40._12_4_ =
       local_c0._12_4_ * auVar39._12_4_ +
       auVar37._12_4_ * local_220._12_4_ + local_a0._12_4_ * auVar38._12_4_;
  auVar40._16_4_ =
       local_c0._16_4_ * auVar39._16_4_ +
       auVar37._16_4_ * local_220._16_4_ + local_a0._16_4_ * auVar38._16_4_;
  auVar40._20_4_ =
       local_c0._20_4_ * auVar39._20_4_ +
       auVar37._20_4_ * local_220._20_4_ + local_a0._20_4_ * auVar38._20_4_;
  auVar40._24_4_ =
       local_c0._24_4_ * auVar39._24_4_ +
       auVar37._24_4_ * local_220._24_4_ + local_a0._24_4_ * auVar38._24_4_;
  auVar40._28_4_ = auVar39._28_4_ + auVar37._28_4_ + auVar38._28_4_;
  local_e0 = vdivps_avx(auVar40,auVar41);
  auVar47 = ZEXT3264(local_e0);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar41._4_4_ = uVar7;
  auVar41._0_4_ = uVar7;
  auVar41._8_4_ = uVar7;
  auVar41._12_4_ = uVar7;
  auVar41._16_4_ = uVar7;
  auVar41._20_4_ = uVar7;
  auVar41._24_4_ = uVar7;
  auVar41._28_4_ = uVar7;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar42._4_4_ = uVar7;
  auVar42._0_4_ = uVar7;
  auVar42._8_4_ = uVar7;
  auVar42._12_4_ = uVar7;
  auVar42._16_4_ = uVar7;
  auVar42._20_4_ = uVar7;
  auVar42._24_4_ = uVar7;
  auVar42._28_4_ = uVar7;
  auVar41 = vcmpps_avx(auVar41,local_e0,2);
  auVar37 = vcmpps_avx(local_e0,auVar42,2);
  auVar41 = vandps_avx(auVar41,auVar37);
  auVar38 = auVar35 & auVar41;
  if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar38 >> 0x7f,0) != '\0') ||
        (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar38 >> 0xbf,0) != '\0') ||
      (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar38[0x1f] < '\0') {
    auVar41 = vandps_avx(auVar41,auVar35);
    auVar39 = vunpckhps_avx(auVar22,auVar44);
    fVar15 = local_e0._0_4_;
    fVar16 = local_e0._4_4_;
    fVar17 = local_e0._8_4_;
    fVar18 = local_e0._12_4_;
    fVar19 = local_e0._16_4_;
    fVar20 = local_e0._20_4_;
    fVar21 = local_e0._24_4_;
    auVar43._0_4_ = fVar6 + fVar2 * fVar15;
    auVar43._4_4_ = fVar6 + fVar2 * fVar16;
    auVar43._8_4_ = fVar6 + fVar2 * fVar17;
    auVar43._12_4_ = fVar6 + fVar2 * fVar18;
    auVar43._16_4_ = fVar6 + fVar2 * fVar19;
    auVar43._20_4_ = fVar6 + fVar2 * fVar20;
    auVar43._24_4_ = fVar6 + fVar2 * fVar21;
    auVar43._28_4_ = fVar6 + auVar37._28_4_;
    auVar46._0_4_ = fVar1 + fVar3 * fVar15;
    auVar46._4_4_ = fVar1 + fVar3 * fVar16;
    auVar46._8_4_ = fVar1 + fVar3 * fVar17;
    auVar46._12_4_ = fVar1 + fVar3 * fVar18;
    auVar46._16_4_ = fVar1 + fVar3 * fVar19;
    auVar46._20_4_ = fVar1 + fVar3 * fVar20;
    auVar46._24_4_ = fVar1 + fVar3 * fVar21;
    auVar46._28_4_ = fVar1 + auVar22._28_4_;
    auVar45._0_4_ = fVar5 + fVar4 * fVar15;
    auVar45._4_4_ = fVar5 + fVar4 * fVar16;
    auVar45._8_4_ = fVar5 + fVar4 * fVar17;
    auVar45._12_4_ = fVar5 + fVar4 * fVar18;
    auVar45._16_4_ = fVar5 + fVar4 * fVar19;
    auVar45._20_4_ = fVar5 + fVar4 * fVar20;
    auVar45._24_4_ = fVar5 + fVar4 * fVar21;
    auVar45._28_4_ = fVar5 + auVar44._28_4_;
    auVar35 = vsubps_avx(auVar43,auVar36);
    auVar37 = vsubps_avx(auVar46,auVar50);
    auVar38 = vsubps_avx(auVar45,local_240);
    auVar44._0_4_ =
         auVar35._0_4_ * auVar35._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar38._0_4_ * auVar38._0_4_;
    auVar44._4_4_ =
         auVar35._4_4_ * auVar35._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar38._4_4_ * auVar38._4_4_;
    auVar44._8_4_ =
         auVar35._8_4_ * auVar35._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar38._8_4_ * auVar38._8_4_;
    auVar44._12_4_ =
         auVar35._12_4_ * auVar35._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar38._12_4_ * auVar38._12_4_;
    auVar44._16_4_ =
         auVar35._16_4_ * auVar35._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar38._16_4_ * auVar38._16_4_;
    auVar44._20_4_ =
         auVar35._20_4_ * auVar35._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar38._20_4_ * auVar38._20_4_;
    auVar44._24_4_ =
         auVar35._24_4_ * auVar35._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar38._24_4_ * auVar38._24_4_;
    auVar44._28_4_ = auVar35._28_4_ + auVar37._28_4_ + auVar38._28_4_;
    auVar22._4_4_ = auVar39._4_4_ * auVar39._4_4_;
    auVar22._0_4_ = auVar39._0_4_ * auVar39._0_4_;
    auVar22._8_4_ = auVar39._8_4_ * auVar39._8_4_;
    auVar22._12_4_ = auVar39._12_4_ * auVar39._12_4_;
    auVar22._16_4_ = auVar39._16_4_ * auVar39._16_4_;
    auVar22._20_4_ = auVar39._20_4_ * auVar39._20_4_;
    auVar22._24_4_ = auVar39._24_4_ * auVar39._24_4_;
    auVar22._28_4_ = auVar39._28_4_;
    auVar35 = vcmpps_avx(auVar44,auVar22,1);
    auVar37 = auVar41 & auVar35;
    if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0x7f,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar37 >> 0xbf,0) != '\0') ||
        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar37[0x1f] < '\0')
    {
      local_260 = vandps_avx(auVar41,auVar35);
      local_100 = ZEXT832(0) << 0x20;
      local_120 = ZEXT832(0) << 0x20;
      local_80 = local_220._0_8_;
      uStack_78 = local_220._8_8_;
      uStack_70 = local_220._16_8_;
      uStack_68 = local_220._24_8_;
      auVar50._8_4_ = 0x7f800000;
      auVar50._0_8_ = 0x7f8000007f800000;
      auVar50._12_4_ = 0x7f800000;
      auVar50._16_4_ = 0x7f800000;
      auVar50._20_4_ = 0x7f800000;
      auVar50._24_4_ = 0x7f800000;
      auVar50._28_4_ = 0x7f800000;
      auVar51 = ZEXT3264(auVar50);
      auVar41 = vblendvps_avx(auVar50,local_e0,local_260);
      auVar35 = vshufps_avx(auVar41,auVar41,0xb1);
      auVar35 = vminps_avx(auVar41,auVar35);
      auVar37 = vshufpd_avx(auVar35,auVar35,5);
      auVar35 = vminps_avx(auVar35,auVar37);
      auVar37 = vperm2f128_avx(auVar35,auVar35,1);
      auVar35 = vminps_avx(auVar35,auVar37);
      auVar35 = vcmpps_avx(auVar41,auVar35,0);
      auVar37 = local_260 & auVar35;
      auVar41 = local_260;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0x7f,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0xbf,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar37[0x1f] < '\0') {
        auVar41 = vandps_avx(auVar35,local_260);
      }
      uVar24 = vmovmskps_avx(auVar41);
      uVar25 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
        }
      }
      puVar28 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar41 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar53 = ZEXT3264(auVar41);
      auVar55 = ZEXT464(0) << 0x20;
      auVar57 = vpcmpeqd_avx(auVar56,auVar56);
      auVar59 = ZEXT1664(auVar57);
      auVar62 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      do {
        local_2b0.hit = local_1f0;
        local_2b0.valid = (int *)&local_2d0;
        uVar26 = (ulong)uVar25;
        uVar25 = *(uint *)(local_140 + uVar26 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar25].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_260 + uVar26 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar7 = *(undefined4 *)(local_120 + uVar26 * 4);
            uVar8 = *(undefined4 *)(local_100 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_e0 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_c0 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_a0 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_80 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar7;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[uVar26];
            *(uint *)(ray + k * 4 + 0x120) = uVar25;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_1c0 = *(undefined4 *)(local_120 + uVar26 * 4);
          local_1b0 = *(undefined4 *)(local_100 + uVar26 * 4);
          local_190 = vpshufd_avx(ZEXT416(uVar25),0);
          local_1a0 = (Disc->primIDs).field_0.i[uVar26];
          uVar7 = *(undefined4 *)(local_c0 + uVar26 * 4);
          uVar8 = *(undefined4 *)(local_a0 + uVar26 * 4);
          local_1e0._4_4_ = uVar8;
          local_1e0._0_4_ = uVar8;
          local_1e0._8_4_ = uVar8;
          local_1e0._12_4_ = uVar8;
          uVar8 = *(undefined4 *)((long)&local_80 + uVar26 * 4);
          local_1d0._4_4_ = uVar8;
          local_1d0._0_4_ = uVar8;
          local_1d0._8_4_ = uVar8;
          local_1d0._12_4_ = uVar8;
          local_1f0[0] = (RTCHitN)(char)uVar7;
          local_1f0[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_1f0[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_1f0[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_1f0[4] = (RTCHitN)(char)uVar7;
          local_1f0[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_1f0[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_1f0[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_1f0[8] = (RTCHitN)(char)uVar7;
          local_1f0[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_1f0[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_1f0[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_1f0[0xc] = (RTCHitN)(char)uVar7;
          local_1f0[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_1f0[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_1f0[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1ac = local_1b0;
          uStack_1a8 = local_1b0;
          uStack_1a4 = local_1b0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          local_280 = auVar53._0_32_;
          uStack_17c = context->user->instID[0];
          local_180 = uStack_17c;
          uStack_178 = uStack_17c;
          uStack_174 = uStack_17c;
          uStack_170 = context->user->instPrimID[0];
          uStack_16c = uStack_170;
          uStack_168 = uStack_170;
          uStack_164 = uStack_170;
          local_220._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_e0 + uVar26 * 4);
          local_2d0 = *puVar28;
          uStack_2c8 = puVar28[1];
          local_2b0.geometryUserPtr = pGVar11->userPtr;
          local_2b0.context = context->user;
          local_2b0.N = 4;
          local_160 = auVar47._0_32_;
          local_240._0_16_ = auVar62._0_16_;
          local_2b0.ray = (RTCRayN *)ray;
          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar57 = auVar59._0_16_;
            local_2b8 = puVar28;
            (*pGVar11->intersectionFilterN)(&local_2b0);
            auVar62 = ZEXT1664(local_240._0_16_);
            auVar57 = vpcmpeqd_avx(auVar57,auVar57);
            auVar59 = ZEXT1664(auVar57);
            auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar53 = ZEXT3264(local_280);
            auVar51 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar47 = ZEXT3264(local_160);
            puVar28 = local_2b8;
          }
          auVar9._8_8_ = uStack_2c8;
          auVar9._0_8_ = local_2d0;
          auVar57 = auVar59._0_16_;
          if (auVar9 == (undefined1  [16])0x0) {
            auVar56 = vpcmpeqd_avx(auVar55._0_16_,(undefined1  [16])0x0);
            auVar57 = auVar57 ^ auVar56;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var14)(&local_2b0);
              auVar62 = ZEXT1664(local_240._0_16_);
              auVar57 = vpcmpeqd_avx(auVar57,auVar57);
              auVar59 = ZEXT1664(auVar57);
              auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar53 = ZEXT3264(local_280);
              auVar51 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar47 = ZEXT3264(local_160);
            }
            auVar23._8_8_ = uStack_2c8;
            auVar23._0_8_ = local_2d0;
            auVar56 = vpcmpeqd_avx(auVar55._0_16_,auVar23);
            auVar57 = auVar59._0_16_ ^ auVar56;
            if (auVar23 != (undefined1  [16])0x0) {
              auVar56 = auVar59._0_16_ ^ auVar56;
              auVar9 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])local_2b0.hit);
              *(undefined1 (*) [16])(local_2b0.ray + 0xc0) = auVar9;
              auVar9 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(local_2b0.hit + 0x10));
              *(undefined1 (*) [16])(local_2b0.ray + 0xd0) = auVar9;
              auVar9 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(local_2b0.hit + 0x20));
              *(undefined1 (*) [16])(local_2b0.ray + 0xe0) = auVar9;
              auVar9 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(local_2b0.hit + 0x30));
              *(undefined1 (*) [16])(local_2b0.ray + 0xf0) = auVar9;
              auVar9 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(local_2b0.hit + 0x40));
              *(undefined1 (*) [16])(local_2b0.ray + 0x100) = auVar9;
              auVar9 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(local_2b0.hit + 0x50));
              *(undefined1 (*) [16])(local_2b0.ray + 0x110) = auVar9;
              auVar9 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(local_2b0.hit + 0x60));
              *(undefined1 (*) [16])(local_2b0.ray + 0x120) = auVar9;
              auVar9 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(local_2b0.hit + 0x70));
              *(undefined1 (*) [16])(local_2b0.ray + 0x130) = auVar9;
              auVar56 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(local_2b0.hit + 0x80));
              *(undefined1 (*) [16])(local_2b0.ray + 0x140) = auVar56;
            }
          }
          if ((auVar62._0_16_ & auVar57) == (undefined1  [16])0x0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_220._0_4_;
          }
          *(undefined4 *)(local_260 + uVar26 * 4) = 0;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar36._4_4_ = uVar7;
          auVar36._0_4_ = uVar7;
          auVar36._8_4_ = uVar7;
          auVar36._12_4_ = uVar7;
          auVar36._16_4_ = uVar7;
          auVar36._20_4_ = uVar7;
          auVar36._24_4_ = uVar7;
          auVar36._28_4_ = uVar7;
          auVar41 = vcmpps_avx(auVar47._0_32_,auVar36,2);
          local_260 = vandps_avx(auVar41,local_260);
        }
        if ((((((((local_260 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_260 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_260 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_260 >> 0x7f,0) == '\0') &&
              (local_260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_260 >> 0xbf,0) == '\0') &&
            (local_260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_260[0x1f]) {
          return;
        }
        auVar41 = vblendvps_avx(auVar51._0_32_,auVar47._0_32_,local_260);
        auVar35 = vshufps_avx(auVar41,auVar41,0xb1);
        auVar35 = vminps_avx(auVar41,auVar35);
        auVar37 = vshufpd_avx(auVar35,auVar35,5);
        auVar35 = vminps_avx(auVar35,auVar37);
        auVar37 = vperm2f128_avx(auVar35,auVar35,1);
        auVar35 = vminps_avx(auVar35,auVar37);
        auVar35 = vcmpps_avx(auVar41,auVar35,0);
        auVar37 = local_260 & auVar35;
        auVar41 = local_260;
        if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0x7f,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0xbf,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar37[0x1f] < '\0') {
          auVar41 = vandps_avx(auVar35,local_260);
        }
        uVar24 = vmovmskps_avx(auVar41);
        uVar25 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }